

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cc
# Opt level: O0

void __thiscall
cnn::PickNegLogSoftmax::backward_impl
          (PickNegLogSoftmax *this,
          vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  uint uVar1;
  const_reference ppTVar2;
  Scalar *pSVar3;
  DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
  *this_00;
  DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_> *pDVar4;
  runtime_error *this_01;
  long in_RCX;
  DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_> *this_02;
  Dim *in_RDX;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *in_RSI;
  MatrixBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_> *in_RDI;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> dEdxi_mat;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x_1;
  float err_1;
  value_type elem_1;
  uint b;
  Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_> x;
  float err;
  uint elem;
  undefined4 in_stack_fffffffffffffe80;
  float in_stack_fffffffffffffe84;
  float fVar5;
  DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
  *in_stack_fffffffffffffe88;
  DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
  *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  Tensor *in_stack_fffffffffffffea8;
  uint in_stack_fffffffffffffeb4;
  FNegLogSoftmaxBackward in_stack_fffffffffffffeb8;
  uint local_cc;
  FNegLogSoftmaxBackward local_88 [10];
  float local_38;
  undefined4 local_34;
  long local_20;
  Dim *local_18;
  vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_> *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  ppTVar2 = std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[]
                      (in_RSI,0);
  uVar1 = Dim::cols(&(*ppTVar2)->d);
  if (uVar1 != 1) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_01,"PickNegLogSoftmax::backward not yet implemented for multiple columns");
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (*(long *)(in_RDI + 0x60) == 0) {
    if (*(long *)(in_RDI + 0x80) == 0) {
      __assert_fail("pvals",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                    ,0x4b8,
                    "virtual void cnn::PickNegLogSoftmax::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                   );
    }
    this_00 = (DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
               *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                           (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x80)
                           );
    uVar1 = Dim::batch_elems(local_18);
    if (this_00 !=
        (DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>,_1>
         *)(ulong)uVar1) {
      __assert_fail("pvals->size() == fx.d.batch_elems()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/nodes.cc"
                    ,0x4b9,
                    "virtual void cnn::PickNegLogSoftmax::backward_impl(const vector<const Tensor *> &, const Tensor &, const Tensor &, unsigned int, Tensor &) const"
                   );
    }
    local_cc = 0;
    while( true ) {
      this_02 = (DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                 *)(ulong)local_cc;
      pDVar4 = (DenseBase<Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>
                *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                            (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)
                              (in_RDI + 0x80));
      if (pDVar4 <= this_02) break;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                (*(vector<unsigned_int,_std::allocator<unsigned_int>_> **)(in_RDI + 0x80),
                 (ulong)local_cc);
      fVar5 = *(float *)(*(long *)(local_20 + 0x28) + (ulong)local_cc * 4);
      std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](local_10,0)
      ;
      Tensor::batch_matrix((Tensor *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4);
      Tensor::batch_matrix((Tensor *)in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4);
      FNegLogSoftmaxBackward::FNegLogSoftmaxBackward
                ((FNegLogSoftmaxBackward *)&stack0xfffffffffffffeb8,
                 *(float *)(*(long *)(in_RDI + 0x50) + (ulong)local_cc * 4),fVar5);
      Eigen::
      DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>::
      unaryExpr<cnn::FNegLogSoftmaxBackward>
                (this_02,(FNegLogSoftmaxBackward *)
                         CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
      Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
      operator+=(in_RDI,(MatrixBase<Eigen::CwiseUnaryOp<cnn::FNegLogSoftmaxBackward,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
                         *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      pSVar3 = Eigen::
               DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
               ::operator()(this_00,(Index)this_02);
      *pSVar3 = *pSVar3 - fVar5;
      local_cc = local_cc + 1;
      in_stack_fffffffffffffe84 = fVar5;
    }
  }
  else {
    local_34 = **(undefined4 **)(in_RDI + 0x60);
    local_38 = **(float **)(local_20 + 0x28);
    std::vector<const_cnn::Tensor_*,_std::allocator<const_cnn::Tensor_*>_>::operator[](local_10,0);
    Tensor::operator*(in_stack_fffffffffffffea8);
    FNegLogSoftmaxBackward::FNegLogSoftmaxBackward(local_88,**(float **)(in_RDI + 0x50),local_38);
    Eigen::DenseBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>_>
    ::unaryExpr<cnn::FNegLogSoftmaxBackward>
              (in_stack_fffffffffffffe88,
               (FNegLogSoftmaxBackward *)
               CONCAT44(in_stack_fffffffffffffe84,in_stack_fffffffffffffe80));
    Tensor::operator*(in_stack_fffffffffffffea8);
    Eigen::MatrixBase<Eigen::Map<Eigen::Matrix<float,-1,-1,0,-1,-1>,0,Eigen::Stride<0,0>>>::
    operator+=(in_RDI,(MatrixBase<Eigen::CwiseUnaryOp<cnn::FNegLogSoftmaxBackward,_const_Eigen::Map<Eigen::Matrix<float,__1,__1,_0,__1,__1>,_0,_Eigen::Stride<0,_0>_>_>_>
                       *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    fVar5 = local_38;
    Tensor::operator*(in_stack_fffffffffffffea8);
    pSVar3 = Eigen::
             DenseCoeffsBase<Eigen::Map<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::Stride<0,_0>_>,_1>
             ::operator()(in_stack_fffffffffffffe90,(Index)in_stack_fffffffffffffe88);
    *pSVar3 = *pSVar3 - fVar5;
  }
  return;
}

Assistant:

void PickNegLogSoftmax::backward_impl(const vector<const Tensor*>& xs,
                            const Tensor& fx,
                            const Tensor& dEdf,
                            unsigned i,
                            Tensor& dEdxi) const {
  if (xs[0]->d.cols() == 1) {
#if HAVE_CUDA
    if(pval) {
      const auto elem = *pval;
      gpu::pnlsoftmax_backward(dEdxi.d.size(), elem, xs[0]->v, dEdf.v, logz, dEdxi.v);
    } else {
      assert(pvals);
      assert(pvals->size() == fx.d.batch_elems()); 
      // TODO: Again, it would be nice to do this with a single kernel
      for(unsigned b = 0; b < pvals->size(); ++b) {
        const auto elem = (*pvals)[b];
        gpu::pnlsoftmax_backward(dEdxi.d.batch_size(), elem, xs[0]->batch_ptr(b), dEdf.v+b, logz+b, dEdxi.batch_ptr(b));
      }
    }
#else
    if(pval) {
      const auto elem = *pval;
      const float err = dEdf.v[0];
      auto x = **xs[0];
      // logz is computed in the forward pass and cached
      *dEdxi += x.unaryExpr(FNegLogSoftmaxBackward(*logz, err));
      //*dEdxi += x.unaryExpr(scalar_nlsoftmax_backward_op<float>(*logz, err));
      (*dEdxi)(elem) -= err;
    } else {
      assert(pvals);
      assert(pvals->size() == fx.d.batch_elems()); 
      for(unsigned b = 0; b < pvals->size(); ++b) {
        const auto elem = (*pvals)[b];
        const float err = dEdf.v[b];
        auto x = xs[0]->batch_matrix(b);
        auto dEdxi_mat = dEdxi.batch_matrix(b);
        dEdxi_mat += x.unaryExpr(FNegLogSoftmaxBackward(logz[b], err));
        //dEdxi_mat += x.unaryExpr(scalar_nlsoftmax_backward_op<float>(logz[b], err));
        dEdxi_mat(elem) -= err;
      }
    }
#endif
  } else {
    throw std::runtime_error("PickNegLogSoftmax::backward not yet implemented for multiple columns");
  }
}